

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  byte bVar1;
  nk_plugin_alloc p_Var2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  nk_font *pnVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  nk_font_config *pnVar10;
  ushort *puVar11;
  ushort *puVar12;
  byte bVar13;
  nk_font_config local_88;
  
  bVar13 = 0;
  if ((((compressed_data == (void *)0x0 || atlas == (nk_font_atlas *)0x0) ||
       ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)) ||
      ((atlas->temporary).free == (nk_plugin_free)0x0)) ||
     ((p_Var2 = (atlas->permanent).alloc, p_Var2 == (nk_plugin_alloc)0x0 ||
      ((atlas->permanent).free == (nk_plugin_free)0x0)))) {
    pnVar6 = (nk_font *)0x0;
  }
  else {
    uVar3 = nk_decompress_length((uchar *)compressed_data);
    pnVar6 = (nk_font *)0x0;
    puVar5 = (uchar *)(*p_Var2)((atlas->permanent).userdata,(void *)0x0,(ulong)uVar3);
    if (puVar5 != (uchar *)0x0) {
      uVar4 = *compressed_data;
      if (((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) ==
           0x57bc0000) &&
         (uVar4 = *(uint *)((long)compressed_data + 4),
         ((uVar4 >> 0x18 == 0 && (uVar4 & 0xff0000) == 0) && (uVar4 & 0xff00) == 0) &&
         (uVar4 & 0xff) == 0)) {
        uVar4 = nk_decompress_length((uchar *)compressed_data);
        nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
        puVar11 = (ushort *)((long)compressed_data + 0x10);
        nk__barrier2 = (uchar *)compressed_data;
        nk__barrier = puVar5 + uVar4;
        nk__barrier4 = puVar5;
        nk__dout = puVar5;
        do {
          bVar1 = (byte)*puVar11;
          uVar9 = (uint)bVar1;
          if (bVar1 < 0x20) {
            if (bVar1 < 0x18) {
              if (bVar1 < 0x10) {
                if (bVar1 < 8) {
                  if (bVar1 == 4) {
                    nk__match(nk__dout +
                              ~((ulong)*(byte *)((long)puVar11 + 3) |
                                (ulong)*(byte *)((long)puVar11 + 1) << 0x10 |
                               (ulong)(byte)puVar11[1] << 8),
                              (ushort)(puVar11[2] << 8 | puVar11[2] >> 8) + 1);
                    puVar12 = puVar11 + 3;
                  }
                  else {
                    if (uVar9 != 6) {
                      if (uVar9 == 7) {
                        nk__lit((byte *)((long)puVar11 + 3),
                                (ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                        *(ushort *)((long)puVar11 + 1) >> 8) + 1);
                        uVar7 = (ulong)(ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                               *(ushort *)((long)puVar11 + 1) >> 8);
                        lVar8 = 4;
                        goto LAB_001131f2;
                      }
                      break;
                    }
                    nk__match(nk__dout +
                              ~((ulong)*(byte *)((long)puVar11 + 3) |
                                (ulong)*(byte *)((long)puVar11 + 1) << 0x10 |
                               (ulong)(byte)puVar11[1] << 8),(byte)puVar11[2] + 1);
                    puVar12 = (ushort *)((long)puVar11 + 5);
                  }
                }
                else {
                  nk__lit((uchar *)(puVar11 + 1),
                          ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar11 + 1)) - 0x7ff);
                  uVar7 = (ulong)(ushort)(*puVar11 << 8 | *puVar11 >> 8);
                  lVar8 = -0x7fd;
LAB_001131f2:
                  puVar12 = (ushort *)((long)puVar11 + uVar7 + lVar8);
                  if (puVar12 == puVar11) break;
                }
              }
              else {
                nk__match(nk__dout +
                          -(ulong)(((uint)*(byte *)((long)puVar11 + 1) * 0x100 +
                                   ((uint)(byte)puVar11[1] | (uint)bVar1 << 0x10)) - 0xfffff),
                          (ushort)(*(ushort *)((long)puVar11 + 3) << 8 |
                                  *(ushort *)((long)puVar11 + 3) >> 8) + 1);
                puVar12 = (ushort *)((long)puVar11 + 5);
              }
            }
            else {
              nk__match(nk__dout +
                        -(ulong)(((uint)*(byte *)((long)puVar11 + 1) * 0x100 +
                                 ((uint)(byte)puVar11[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                        *(byte *)((long)puVar11 + 3) + 1);
              puVar12 = puVar11 + 2;
            }
          }
          else if ((char)bVar1 < '\0') {
            nk__match(nk__dout + ~(ulong)*(byte *)((long)puVar11 + 1),uVar9 - 0x7f);
            puVar12 = puVar11 + 1;
          }
          else {
            if (bVar1 < 0x40) {
              nk__lit((byte *)((long)puVar11 + 1),uVar9 - 0x1f);
              uVar7 = (ulong)(byte)*puVar11;
              lVar8 = -0x1e;
              goto LAB_001131f2;
            }
            nk__match(nk__dout +
                      -(ulong)(((uint)*(byte *)((long)puVar11 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                      (byte)puVar11[1] + 1);
            puVar12 = (ushort *)((long)puVar11 + 3);
          }
          puVar11 = puVar12;
        } while (nk__dout <= puVar5 + uVar4);
      }
      if (config == (nk_font_config *)0x0) {
        nk_font_config(&local_88,height);
      }
      else {
        pnVar10 = &local_88;
        for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
          pnVar10->next = config->next;
          config = (nk_font_config *)((long)config + (ulong)bVar13 * -0x10 + 8);
          pnVar10 = (nk_font_config *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 8);
        }
      }
      local_88.ttf_data_owned_by_atlas = '\x01';
      local_88.ttf_blob = puVar5;
      local_88.ttf_size = (ulong)uVar3;
      local_88.size = height;
      pnVar6 = nk_font_atlas_add(atlas,&local_88);
    }
  }
  return pnVar6;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
void *compressed_data, nk_size compressed_size, float height,
const struct nk_font_config *config)
{
unsigned int decompressed_size;
void *decompressed_data;
struct nk_font_config cfg;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

NK_ASSERT(compressed_data);
NK_ASSERT(compressed_size);
if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
NK_ASSERT(decompressed_data);
if (!decompressed_data) return 0;
nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
(unsigned int)compressed_size);

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = decompressed_data;
cfg.ttf_size = decompressed_size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 1;
return nk_font_atlas_add(atlas, &cfg);
}